

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void insert<16000u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  TrieNode<unsigned_char> *pTVar3;
  pointer pppuVar4;
  ulong uVar5;
  vector_bagwell<unsigned_char_*,_16U> *pvVar6;
  TrieNode<unsigned_char> *pTVar7;
  ulong uVar8;
  size_t depth;
  size_t sVar9;
  ulong uVar10;
  uchar *str;
  BurstSimple<unsigned_char> local_61;
  TrieNode<unsigned_char> *local_60;
  size_t local_58;
  uchar **local_50;
  vector_bagwell<unsigned_char_*,_16U> *local_48;
  size_t local_40;
  byte *local_38;
  
  if (n != 0) {
    sVar9 = 0;
    local_60 = root;
    local_58 = n;
    local_50 = strings;
    do {
      local_38 = local_50[sVar9];
      if (local_38 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar2 = *local_38;
      uVar10 = (ulong)bVar2;
      uVar8 = (ulong)(bVar2 >> 6);
      depth = 1;
      uVar5 = (local_60->is_trie).super__Base_bitset<4UL>._M_w[uVar8] >> (uVar10 & 0x3f);
      pTVar3 = local_60;
      while ((uVar5 & 1) != 0) {
        if ((char)uVar10 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_bagwell<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                       );
        }
        pTVar3 = (TrieNode<unsigned_char> *)(pTVar3->buckets)._M_elems[uVar10];
        bVar2 = local_38[depth];
        uVar10 = (ulong)bVar2;
        uVar8 = (ulong)(bVar2 >> 6);
        depth = depth + 1;
        uVar5 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w[uVar8] >> (uVar10 & 0x3f);
      }
      pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)(pTVar3->buckets)._M_elems[uVar10];
      local_40 = sVar9;
      if (pvVar6 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
        pvVar6 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar6->_insertpos = (uchar **)0x0;
        pvVar6->_left_in_block = 0;
        (pTVar3->buckets)._M_elems[uVar10] = pvVar6;
      }
      local_48 = pvVar6;
      vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar6,&local_38);
      pvVar6 = local_48;
      if (((bVar2 != 0) && (local_48->_insertpos != (uchar **)0x0)) &&
         (pppuVar4 = (local_48->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish,
         0x1f400 < (ulong)((long)local_48->_insertpos +
                          ((long)((1 << ((char)((uint)((int)pppuVar4 -
                                                      *(int *)&(local_48->_index_block).
                                                                                                                              
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                         3U & 0x1f)) + -0x10) * 8 - (long)pppuVar4[-1])))) {
        pTVar7 = BurstSimple<unsigned_char>::operator()(&local_61,local_48,depth);
        (pTVar3->buckets)._M_elems[uVar10] = pTVar7;
        p_Var1 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w + uVar8;
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell(pvVar6);
        operator_delete(pvVar6);
      }
      sVar9 = local_40 + 1;
    } while (sVar9 != local_58);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}